

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcParser.h
# Opt level: O3

void __thiscall Calc::CalcParser::translateUnaryOperation(CalcParser *this,ProductionEnum operation)

{
  iterator __position;
  float fVar1;
  float local_c;
  
  __position._M_current =
       (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c = 0.0;
  if ((this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start == __position._M_current) {
    fVar1 = 0.0;
  }
  else {
    fVar1 = __position._M_current[-1];
    __position._M_current = __position._M_current + -1;
    (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current;
  }
  if (operation == Negation) {
    local_c = -fVar1;
  }
  if (__position._M_current ==
      (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)&this->numbers,__position,&local_c);
  }
  else {
    *__position._M_current = local_c;
    (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void translateUnaryOperation(ProductionEnum operation) {
        auto const operand = extractNumber();
        auto const result  = evaluate(operation, operand);
        storeNumber(result);
    }